

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int is_prime(int num)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = 2;
  iVar2 = 2;
  if (2 < num) {
    do {
      iVar2 = (int)uVar3;
      if ((int)((ulong)(uint)num % uVar3) == 0) break;
      uVar1 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar1;
      iVar2 = num;
    } while (num != uVar1);
  }
  return (int)(iVar2 == num);
}

Assistant:

int is_prime(int num) {
	int i;
	for (i = 2; i < num; i++) {
		if ((num % i) == 0) {
			break;
		}
	}
	if (i == num) {
		return 1;
	}
	return 0;
}